

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QRingBuffer::clear(QRingBuffer *this)

{
  iterator iVar1;
  iterator aend;
  
  if ((this->buffers).d.size != 0) {
    iVar1 = QList<QRingChunk>::begin(&this->buffers);
    aend = QList<QRingChunk>::end(&this->buffers);
    QList<QRingChunk>::erase(&this->buffers,iVar1.i + 1,(const_iterator)aend.i);
    iVar1 = QList<QRingChunk>::begin(&this->buffers);
    QRingChunk::clear(iVar1.i);
    this->bufferSize = 0;
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }